

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

CopyResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::CopyPrefix
          (CordRepBtree *this,size_t n,bool allow_folding)

{
  RefcountAndFlags *pRVar1;
  int *piVar2;
  byte bVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  CordRepBtree *tree;
  long lVar12;
  uint8_t *puVar13;
  ulong uVar14;
  CordRepBtree *pCVar15;
  CordRepBtree *rep;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  CordRepBtree *pCVar21;
  ulong uVar22;
  ulong n_00;
  uint8_t uVar23;
  ulong uVar24;
  CopyResult CVar25;
  
  if (n == 0) {
    __assert_fail("n > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x2f7,"CopyResult absl::cord_internal::CordRepBtree::CopyPrefix(size_t, bool)");
  }
  if ((this->super_CordRep).length < n) {
    __assert_fail("n <= this->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x2f8,"CopyResult absl::cord_internal::CordRepBtree::CopyPrefix(size_t, bool)");
  }
  bVar3 = (this->super_CordRep).storage[0];
  uVar19 = (uint)bVar3;
  if (allow_folding) {
    tree = (CordRepBtree *)this->edges_[(this->super_CordRep).storage[1]];
    uVar16 = (tree->super_CordRep).length;
    if (n <= uVar16) {
      if (bVar3 != 0) {
        iVar18 = uVar19 + 1;
        this = tree;
        do {
          if ((this->super_CordRep).tag != '\x03') goto LAB_00340b96;
          tree = (CordRepBtree *)this->edges_[(this->super_CordRep).storage[1]];
          uVar16 = (tree->super_CordRep).length;
          if (uVar16 < n) {
            uVar19 = iVar18 - 2;
            goto LAB_00340877;
          }
          iVar18 = iVar18 + -1;
          this = tree;
        } while (1 < iVar18);
      }
      LOCK();
      pRVar1 = &(tree->super_CordRep).refcount;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + 2;
      UNLOCK();
      uVar19 = 0xffffffff;
      if (uVar16 != n) {
        tree = (CordRepBtree *)anon_unknown_0::CreateSubstring(&tree->super_CordRep,0,n);
      }
      goto LAB_00340b3b;
    }
  }
LAB_00340877:
  uVar16 = (this->super_CordRep).length;
  if (uVar16 == n) {
    LOCK();
    pRVar1 = &(this->super_CordRep).refcount;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + 2;
    UNLOCK();
    tree = this;
  }
  else {
    if (uVar16 <= n) {
LAB_00340bf3:
      __assert_fail("offset < length",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x329,
                    "CordRepBtree::Position absl::cord_internal::CordRepBtree::IndexOf(size_t) const"
                   );
    }
    uVar17 = (ulong)(this->super_CordRep).storage[1];
    uVar16 = this->edges_[uVar17]->length;
    n_00 = n;
    uVar24 = uVar17;
    uVar20 = uVar17;
    if (uVar16 <= n) {
      do {
        n_00 = n_00 - uVar16;
        uVar24 = uVar20 + 1;
        uVar16 = this->edges_[uVar20 + 1]->length;
        uVar20 = uVar24;
      } while (uVar16 <= n_00);
    }
    if (6 < uVar24) {
LAB_00340c12:
      __assert_fail("end <= capacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x2cb,
                    "CordRepBtree *absl::cord_internal::CordRepBtree::CopyBeginTo(size_t, size_t) const"
                   );
    }
    if (uVar24 < uVar17) {
LAB_00340c31:
      __assert_fail("end >= this->begin()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x2cc,
                    "CordRepBtree *absl::cord_internal::CordRepBtree::CopyBeginTo(size_t, size_t) const"
                   );
    }
    tree = (CordRepBtree *)operator_new(0x40);
    (tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
    (tree->super_CordRep).length = n;
    uVar7 = *(undefined8 *)((long)this->edges_ + 4);
    uVar8 = *(undefined8 *)((long)this->edges_ + 0xc);
    uVar9 = *(undefined8 *)((long)this->edges_ + 0x14);
    uVar10 = *(undefined8 *)((long)this->edges_ + 0x1c);
    uVar11 = *(undefined8 *)((long)this->edges_ + 0x24);
    *(undefined8 *)&(tree->super_CordRep).tag = *(undefined8 *)&(this->super_CordRep).tag;
    *(undefined8 *)((long)tree->edges_ + 4) = uVar7;
    *(undefined8 *)((long)tree->edges_ + 0xc) = uVar8;
    *(undefined8 *)((long)tree->edges_ + 0x14) = uVar9;
    *(undefined8 *)((long)tree->edges_ + 0x1c) = uVar10;
    *(undefined8 *)((long)tree->edges_ + 0x24) = uVar11;
    *(undefined4 *)((long)tree->edges_ + 0x2c) = *(undefined4 *)((long)this->edges_ + 0x2c);
    (tree->super_CordRep).storage[2] = (uint8_t)uVar24;
    bVar3 = (tree->super_CordRep).storage[1];
    if (uVar24 != bVar3) {
      lVar12 = (ulong)bVar3 << 3;
      do {
        lVar4 = *(long *)((long)tree->edges_ + lVar12);
        if (lVar4 == 0) goto LAB_00340b77;
        LOCK();
        piVar2 = (int *)(lVar4 + 8);
        *piVar2 = *piVar2 + 2;
        UNLOCK();
        lVar12 = lVar12 + 8;
      } while (uVar24 * 8 - lVar12 != 0);
    }
    puVar13 = &(tree->super_CordRep).tag;
    pCVar21 = tree;
    uVar6 = uVar19;
    do {
      uVar23 = (uint8_t)uVar24;
      if (n_00 == 0) {
        (pCVar21->super_CordRep).storage[2] = uVar23;
        if (*puVar13 != '\x03') {
LAB_00340b96:
          __assert_fail("IsBtree()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                        ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
        }
        AssertValid(tree,true);
        break;
      }
      if (uVar24 < (this->super_CordRep).storage[1]) {
        __assert_fail("index >= begin()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
      }
      if ((this->super_CordRep).storage[2] <= uVar24) {
        __assert_fail("index < end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
      }
      rep = (CordRepBtree *)this->edges_[uVar24];
      if ((int)uVar6 < 1) {
        if (rep == (CordRepBtree *)0x0) {
LAB_00340b77:
          __assert_fail("rep != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
        }
        LOCK();
        pRVar1 = &(rep->super_CordRep).refcount;
        (pRVar1->count_).super___atomic_base<int>._M_i =
             (pRVar1->count_).super___atomic_base<int>._M_i + 2;
        UNLOCK();
        if ((rep->super_CordRep).length != n_00) {
          rep = (CordRepBtree *)anon_unknown_0::CreateSubstring((CordRep *)rep,0,n_00);
        }
        pCVar21->edges_[uVar24] = &rep->super_CordRep;
        (pCVar21->super_CordRep).storage[2] = uVar23 + '\x01';
        if (*puVar13 != '\x03') goto LAB_00340b96;
        AssertValid(tree,true);
      }
      else {
        if ((rep->super_CordRep).tag != '\x03') goto LAB_00340b96;
        if ((rep->super_CordRep).length <= n_00) goto LAB_00340bf3;
        uVar14 = (ulong)(rep->super_CordRep).storage[1];
        uVar16 = rep->edges_[uVar14]->length;
        uVar20 = uVar14;
        uVar17 = uVar14;
        uVar22 = n_00;
        if (uVar16 <= n_00) {
          do {
            uVar22 = uVar22 - uVar16;
            uVar20 = uVar17 + 1;
            uVar16 = rep->edges_[uVar17 + 1]->length;
            uVar17 = uVar20;
          } while (uVar16 <= uVar22);
        }
        if (6 < uVar20) goto LAB_00340c12;
        if (uVar20 < uVar14) goto LAB_00340c31;
        pCVar15 = (CordRepBtree *)operator_new(0x40);
        (pCVar15->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
        (pCVar15->super_CordRep).length = n_00;
        uVar7 = *(undefined8 *)((long)rep->edges_ + 4);
        uVar8 = *(undefined8 *)((long)rep->edges_ + 0xc);
        uVar9 = *(undefined8 *)((long)rep->edges_ + 0x14);
        uVar10 = *(undefined8 *)((long)rep->edges_ + 0x1c);
        uVar11 = *(undefined8 *)((long)rep->edges_ + 0x24);
        *(undefined8 *)&(pCVar15->super_CordRep).tag = *(undefined8 *)&(rep->super_CordRep).tag;
        *(undefined8 *)((long)pCVar15->edges_ + 4) = uVar7;
        *(undefined8 *)((long)pCVar15->edges_ + 0xc) = uVar8;
        *(undefined8 *)((long)pCVar15->edges_ + 0x14) = uVar9;
        *(undefined8 *)((long)pCVar15->edges_ + 0x1c) = uVar10;
        *(undefined8 *)((long)pCVar15->edges_ + 0x24) = uVar11;
        *(undefined4 *)((long)pCVar15->edges_ + 0x2c) = *(undefined4 *)((long)rep->edges_ + 0x2c);
        (pCVar15->super_CordRep).storage[2] = (uint8_t)uVar20;
        bVar3 = (pCVar15->super_CordRep).storage[1];
        if (uVar20 != bVar3) {
          lVar12 = (ulong)bVar3 << 3;
          do {
            lVar4 = *(long *)((long)pCVar15->edges_ + lVar12);
            if (lVar4 == 0) goto LAB_00340b77;
            LOCK();
            piVar2 = (int *)(lVar4 + 8);
            *piVar2 = *piVar2 + 2;
            UNLOCK();
            lVar12 = lVar12 + 8;
          } while (uVar20 * 8 - lVar12 != 0);
        }
        pCVar21->edges_[uVar24] = (CordRep *)pCVar15;
        (pCVar21->super_CordRep).storage[2] = uVar23 + '\x01';
        pCVar21 = pCVar15;
        this = rep;
        n_00 = uVar22;
        uVar24 = uVar20;
      }
      bVar5 = 0 < (int)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar5);
  }
LAB_00340b3b:
  CVar25.height = uVar19;
  CVar25.edge = &tree->super_CordRep;
  CVar25._12_4_ = 0;
  return CVar25;
}

Assistant:

CopyResult CordRepBtree::CopyPrefix(size_t n, bool allow_folding) {
  assert(n > 0);
  assert(n <= this->length);

  // As long as `n` does not exceed the length of the first edge, we can 'drop'
  // the current depth. For the most extreme example: if we'd copy a 1 byte
  // prefix from a tree, there is only a single edge / path from the top of the
  // tree to the single data edge containing this byte, so we can drop all the
  // nodes except the data node.
  int height = this->height();
  CordRepBtree* node = this;
  CordRep* front = node->Edge(kFront);
  if (allow_folding) {
    while (front->length >= n) {
      if (--height < 0) return {MakeSubstring(CordRep::Ref(front), 0, n), -1};
      node = front->btree();
      front = node->Edge(kFront);
    }
  }
  if (node->length == n) return {CordRep::Ref(node), height};

  // `n` spans at least two nodes, find the end point of the span.
  Position pos = node->IndexOf(n);

  // Create a partial copy of the node up to `pos.index`, with a defined length
  // of `n`. Any 'partial last edge' is added further below as needed.
  CordRepBtree* sub = node->CopyBeginTo(pos.index, n);
  const CopyResult result = {sub, height};

  // `pos.n` contains the 'offset inside the edge for IndexOf(n)'. As long as
  // this is not zero, we don't have a 'clean cut', so we need to make a
  // (partial) copy of that last edge, and repeat this until pos.n is zero.
  while (pos.n != 0) {
    size_t end = pos.index;
    n = pos.n;

    CordRep* edge = node->Edge(pos.index);
    if (--height < 0) {
      sub->edges_[end++] = MakeSubstring(CordRep::Ref(edge), 0, n);
      sub->set_end(end);
      AssertValid(result.edge->btree());
      return result;
    }

    node = edge->btree();
    pos = node->IndexOf(n);
    CordRepBtree* nsub = node->CopyBeginTo(pos.index, n);
    sub->edges_[end++] = nsub;
    sub->set_end(end);
    sub = nsub;
  }
  sub->set_end(pos.index);
  AssertValid(result.edge->btree());
  return result;
}